

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O3

int chrono::collision::split_geometries
              (vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               *mgeos,int firstgeo,int ngeos,PQP_REAL *a,PQP_REAL c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer ppCVar3;
  ChGeometry *pCVar4;
  int iVar5;
  int i;
  long lVar6;
  int iVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector vg;
  ulong local_48;
  double local_40;
  ulong local_38;
  
  if (ngeos < 1) {
    iVar7 = 0;
  }
  else {
    lVar6 = (long)firstgeo;
    uVar8 = (ulong)(uint)ngeos;
    iVar7 = 0;
    do {
      (*(mgeos->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar6]->_vptr_ChGeometry[6])(&local_48);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_48;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_38;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *a;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_40 * a[1];
      auVar1 = vfmadd231sd_fma(auVar10,auVar9,auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = a[2];
      auVar1 = vfmadd231sd_fma(auVar1,auVar11,auVar2);
      if (auVar1._0_8_ <= c) {
        ppCVar3 = (mgeos->
                  super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar5 = iVar7 + firstgeo;
        iVar7 = iVar7 + 1;
        pCVar4 = ppCVar3[lVar6];
        ppCVar3[lVar6] = ppCVar3[iVar5];
        (mgeos->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[iVar5] = pCVar4;
      }
      lVar6 = lVar6 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  iVar5 = iVar7;
  if (iVar7 == ngeos) {
    iVar5 = ngeos / 2;
  }
  if (iVar7 == 0) {
    iVar5 = ngeos / 2;
  }
  return iVar5;
}

Assistant:

int split_geometries(std::vector<geometry::ChGeometry*>& mgeos, int firstgeo, int ngeos, PQP_REAL a[3], PQP_REAL c) {
    int c1 = 0;
    PQP_REAL p[3];
    PQP_REAL x;
    geometry::ChGeometry* temp;

    for (int count = 0; count < ngeos; count++) {
        int i = count + firstgeo;

        // loop invariant: up to (but not including) index c1 in group 1,
        // then up to (but not including) index i in group 2
        //
        //  [1] [1] [1] [1] [2] [2] [2] [x] [x] ... [x]
        //                   c1          i
        //
        Vector vg = mgeos[i]->Baricenter();
        p[0] = vg.x();
        p[1] = vg.y();
        p[2] = vg.z();

        x = VdotV(p, a);

        if (x <= c) {
            // group 1
            temp = mgeos[i];
            mgeos[i] = mgeos[firstgeo + c1];
            mgeos[firstgeo + c1] = temp;
            c1++;
        } else {
            // group 2 -- do nothing
        }
    }

    // split arbitrarily if one group empty

    if ((c1 == 0) || (c1 == ngeos))
        c1 = ngeos / 2;

    return c1;
}